

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::formatToDecimalQuantity
          (DecimalFormat *this,Formattable *number,DecimalQuantity *output,UErrorCode *status)

{
  DecimalQuantity *this_00;
  UFormattedNumberData obj;
  UFormattedNumberData local_188;
  
  this_00 = &local_188.quantity;
  local_188.fMagic = 0x46444e00;
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00);
  icu_63::number::impl::NumberStringBuilder::NumberStringBuilder(&local_188.string);
  Formattable::populateDecimalQuantity(number,this_00,status);
  icu_63::number::LocalizedNumberFormatter::formatImpl
            ((this->fields->formatter).
             super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr,&local_188,
             status);
  icu_63::number::impl::DecimalQuantity::operator=(output,this_00);
  icu_63::number::impl::NumberStringBuilder::~NumberStringBuilder(&local_188.string);
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(this_00);
  return;
}

Assistant:

void DecimalFormat::formatToDecimalQuantity(const Formattable& number, DecimalQuantity& output,
                                            UErrorCode& status) const {
    UFormattedNumberData obj;
    number.populateDecimalQuantity(obj.quantity, status);
    fields->formatter->formatImpl(&obj, status);
    output = std::move(obj.quantity);
}